

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void del_tokens(VARR_token_t *tokens,int from,int len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  token_t *pptVar4;
  token_t *addr;
  int tokens_len;
  int diff;
  int len_local;
  int from_local;
  VARR_token_t *tokens_local;
  
  sVar3 = VARR_token_tlength(tokens);
  iVar1 = (int)sVar3;
  pptVar4 = VARR_token_taddr(tokens);
  tokens_len = len;
  if (len < 0) {
    tokens_len = iVar1 - from;
  }
  if (from + tokens_len <= iVar1) {
    iVar2 = (iVar1 - from) - tokens_len;
    if (0 < iVar2) {
      memmove(pptVar4 + from,pptVar4 + (long)from + (long)tokens_len,(long)iVar2 << 3);
    }
    VARR_token_ttrunc(tokens,(long)(iVar1 - tokens_len));
    return;
  }
  __assert_fail("from + len <= tokens_len",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0xa9b,"void del_tokens(VARR_token_t *, int, int)");
}

Assistant:

static void del_tokens (VARR (token_t) * tokens, int from, int len) {
  int diff, tokens_len = (int) VARR_LENGTH (token_t, tokens);
  token_t *addr = VARR_ADDR (token_t, tokens);

  if (len < 0) len = tokens_len - from;
  assert (from + len <= tokens_len);
  if ((diff = tokens_len - from - len) > 0)
    memmove (addr + from, addr + from + len, diff * sizeof (token_t));
  VARR_TRUNC (token_t, tokens, tokens_len - len);
}